

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uoptions.cpp
# Opt level: O3

int u_parseArgs(int argc,char **argv,int optionCount,UOption *options)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  UOption *pUVar12;
  
  iVar5 = 1;
  if (1 < argc) {
    uVar9 = (ulong)(uint)optionCount;
    bVar2 = false;
    iVar6 = 1;
    do {
      pcVar11 = argv[iVar6];
      if (((bVar2) || (*pcVar11 != '-')) || (cVar7 = pcVar11[1], cVar7 == '\0')) {
        lVar8 = (long)iVar5;
        iVar5 = iVar5 + 1;
        argv[lVar8] = pcVar11;
      }
      else {
        pcVar11 = pcVar11 + 2;
        pUVar12 = options;
        if (cVar7 == '-') {
          if (*pcVar11 == '\0') {
            bVar2 = true;
          }
          else {
            uVar10 = uVar9;
            if (optionCount < 1) goto LAB_001db058;
            while ((pUVar12->longName == (char *)0x0 ||
                   (iVar3 = strcmp(pcVar11,pUVar12->longName), iVar3 != 0))) {
              uVar10 = uVar10 - 1;
              pUVar12 = pUVar12 + 1;
              if (uVar10 == 0) goto LAB_001db058;
            }
            pUVar12->doesOccur = '\x01';
            if (pUVar12->hasArg != '\0') {
              iVar3 = iVar6 + 1;
              if ((iVar3 < argc) &&
                 ((pcVar11 = argv[iVar3], *pcVar11 != '-' || (pcVar11[1] == '\0')))) {
                pUVar12->value = pcVar11;
                iVar6 = iVar3;
              }
              else if (pUVar12->hasArg == '\x01') {
LAB_001db053:
                pUVar12->doesOccur = '\0';
                goto LAB_001db058;
              }
            }
            if (pUVar12->optionFn == (UOptionFn *)0x0) goto LAB_001db037;
            iVar3 = (*pUVar12->optionFn)(pUVar12->context,pUVar12);
            if (iVar3 < 0) {
              pUVar12->doesOccur = '\0';
              return -iVar6;
            }
            bVar2 = false;
          }
        }
        else {
          if (optionCount < 1) {
LAB_001db058:
            return -iVar6;
          }
          iVar3 = iVar6 + 1;
          uVar10 = uVar9;
          do {
            while (cVar7 != pUVar12->shortName) {
              uVar10 = uVar10 - 1;
              pUVar12 = pUVar12 + 1;
              if (uVar10 == 0) goto LAB_001db058;
            }
            pUVar12->doesOccur = '\x01';
            if (pUVar12->hasArg != '\0') {
              if (*pcVar11 != '\0') {
                pUVar12->value = pcVar11;
                break;
              }
              if ((iVar3 < argc) && ((pcVar1 = argv[iVar3], *pcVar1 != '-' || (pcVar1[1] == '\0'))))
              {
                pUVar12->value = pcVar1;
                iVar6 = iVar3;
                break;
              }
              if (pUVar12->hasArg == '\x01') goto LAB_001db053;
            }
            if ((pUVar12->optionFn != (UOptionFn *)0x0) &&
               (iVar4 = (*pUVar12->optionFn)(pUVar12->context,pUVar12), iVar4 < 0))
            goto LAB_001db053;
            cVar7 = *pcVar11;
            pcVar11 = pcVar11 + 1;
            uVar10 = uVar9;
            pUVar12 = options;
          } while (cVar7 != '\0');
LAB_001db037:
          bVar2 = false;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  return iVar5;
}

Assistant:

U_CAPI int U_EXPORT2
u_parseArgs(int argc, char* argv[],
            int optionCount, UOption options[]) {
    char *arg;
    int i=1, remaining=1;
    char c, stopOptions=0;

    while(i<argc) {
        arg=argv[i];
        if(!stopOptions && *arg=='-' && (c=arg[1])!=0) {
            /* process an option */
            UOption *option=NULL;
            arg+=2;
            if(c=='-') {
                /* process a long option */
                if(*arg==0) {
                    /* stop processing options after "--" */
                    stopOptions=1;
                } else {
                    /* search for the option string */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(options[j].longName && uprv_strcmp(arg, options[j].longName)==0) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }
                }
            } else {
                /* process one or more short options */
                do {
                    /* search for the option letter */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(c==options[j].shortName) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(*arg!=0) {
                            /* argument following in the same argv[] */
                            option->value=arg;
                            /* do not process the rest of this arg as option letters */
                            break;
                        } else if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                            /* this break is redundant because we know that *arg==0 */
                            break;
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }

                    /* get the next option letter */
                    option=NULL;
                    c=*arg++;
                } while(c!=0);
            }

            /* go to next argv[] */
            ++i;
        } else {
            /* move a non-option up in argv[] */
            argv[remaining++]=arg;
            ++i;
        }
    }
    return remaining;
}